

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcTiming.c
# Opt level: O3

void Abc_NtkTimeSetDefaultOutputLoad(Abc_Ntk_t *pNtk,float Rise,float Fall)

{
  Abc_Time_t *pAVar1;
  Abc_ManTime_t *pAVar2;
  Vec_Ptr_t *pVVar3;
  long lVar4;
  
  pAVar2 = pNtk->pManTime;
  if (pAVar2 == (Abc_ManTime_t *)0x0) {
    pAVar2 = Abc_ManTimeStart(pNtk);
    pNtk->pManTime = pAVar2;
  }
  (pAVar2->tOutLoadDef).Rise = Rise;
  (pAVar2->tOutLoadDef).Fall = Fall;
  if ((pAVar2->tOutLoad != (Abc_Time_t *)0x0) && (pVVar3 = pNtk->vCos, 0 < pVVar3->nSize)) {
    lVar4 = 0;
    do {
      pAVar1 = pNtk->pManTime->tOutLoad;
      if ((((pAVar1[lVar4].Rise == 0.0) && (!NAN(pAVar1[lVar4].Rise))) &&
          (pAVar1[lVar4].Fall == 0.0)) && (!NAN(pAVar1[lVar4].Fall))) {
        pAVar1[lVar4] = pNtk->pManTime->tOutLoadDef;
        pVVar3 = pNtk->vCos;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < pVVar3->nSize);
  }
  return;
}

Assistant:

void Abc_NtkTimeSetDefaultOutputLoad( Abc_Ntk_t * pNtk, float Rise, float Fall )
{
//    if ( Rise == 0.0 && Fall == 0.0 )
//        return;
    if ( pNtk->pManTime == NULL )
        pNtk->pManTime = Abc_ManTimeStart(pNtk);
    pNtk->pManTime->tOutLoadDef.Rise  = Rise;
    pNtk->pManTime->tOutLoadDef.Fall  = Fall;
    if ( pNtk->pManTime->tOutLoad != NULL )
    {
        int i;
        for ( i = 0; i < Abc_NtkCoNum(pNtk); i++ )
            if ( pNtk->pManTime->tOutLoad[i].Rise == 0 && pNtk->pManTime->tOutLoad[i].Fall == 0 )
                pNtk->pManTime->tOutLoad[i] = pNtk->pManTime->tOutLoadDef;
    }
}